

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

fdb_status fdb_iterator_prev(fdb_iterator *iterator)

{
  atomic<unsigned_char> *paVar1;
  uint64_t *value_buf;
  wal_item_action wVar2;
  ushort uVar3;
  docio_handle *handle;
  snap_handle *shandle;
  size_t *keylen;
  fdb_status fVar4;
  btree_result bVar5;
  int iVar6;
  hbtrie_result hVar7;
  wal_item *pwVar8;
  fdb_kvs_handle *pfVar9;
  int64_t iVar10;
  byte bVar11;
  size_t sVar12;
  ulong uVar13;
  void *pvVar14;
  uint64_t uVar15;
  bool bVar16;
  bool bVar17;
  uint64_t offset;
  docio_handle *local_150;
  fdb_seqnum_t seqnum;
  uint64_t local_140;
  docio_object local_138;
  uint64_t hboffset;
  size_t *local_f0;
  int64_t _offset;
  fdb_kvs_id_t kv_id;
  fdb_doc doc_kv;
  docio_object local_88;
  undefined1 local_48 [8];
  fdb_seqnum_t local_40;
  size_t seq_kv_len;
  
  if (iterator == (fdb_iterator *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (iterator->handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  paVar1 = &iterator->handle->handle_busy;
  LOCK();
  bVar16 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\0';
  if (bVar16) {
    (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x01';
  }
  UNLOCK();
  if (!bVar16) {
    return FDB_RESULT_HANDLE_BUSY;
  }
  if (iterator->hbtrie_iterator == (hbtrie_iterator *)0x0) {
    do {
      offset = 0xffffffffffffffff;
      local_138.length.keylen = 0;
      local_138.length.metalen = 0;
      local_138.length.bodylen = 0;
      local_138.length.bodylen_ondisk = 0;
      local_138.length.flag = '\0';
      local_138.length.checksum = '\0';
      local_138.length.reserved = 0;
      local_138.timestamp = 0;
      local_138.meta = (void *)0x0;
      local_138.body = (void *)0x0;
      local_138.key = (void *)0x0;
      local_138.field_3.seqnum = 0;
      if (iterator->direction != '\x02') {
        if (iterator->status == '\0') {
          iterator->_offset = 0xffffffffffffffff;
        }
        pwVar8 = iterator->tree_cursor_prev;
        if ((pwVar8 != (wal_item *)0x0) && (iterator->tree_cursor != pwVar8)) {
          pwVar8 = wal_itr_search_smaller(iterator->wal_itr,pwVar8);
          iterator->tree_cursor = pwVar8;
          iterator->status = '\0';
        }
      }
      bVar16 = false;
LAB_0012da35:
      do {
        seqnum = iterator->_seqnum;
        handle = iterator->handle->dhandle;
        if ((iterator->_offset == 0xffffffffffffffff) ||
           (pwVar8 = iterator->tree_cursor, pwVar8 == (wal_item *)0x0)) {
          if (iterator->handle->kvs == (kvs_info *)0x0) {
            bVar5 = btree_prev(iterator->seqtree_iterator,&seqnum,&offset);
            bVar16 = bVar5 == BTREE_RESULT_SUCCESS;
            pfVar9 = iterator->handle;
LAB_0012dd50:
            btreeblk_end(pfVar9->bhandle);
            if (!bVar16) goto LAB_0012e10f;
            seqnum = seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 |
                     (seqnum & 0xff0000000000) >> 0x18 | (seqnum & 0xff00000000) >> 8 |
                     (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18 |
                     (seqnum & 0xff00) << 0x28 | seqnum << 0x38;
            iterator->_seqnum = seqnum;
            if ((iterator->field_10).start_seqnum <= seqnum) {
              offset = offset >> 0x38 | (offset & 0xff000000000000) >> 0x28 |
                       (offset & 0xff0000000000) >> 0x18 | (offset & 0xff00000000) >> 8 |
                       (offset & 0xff000000) << 8 | (offset & 0xff0000) << 0x18 |
                       (offset & 0xff00) << 0x28 | offset << 0x38;
              iterator->status = '\0';
              uVar3 = iterator->opt;
              bVar16 = true;
              goto LAB_0012dacd;
            }
          }
          else {
            hVar7 = hbtrie_prev(iterator->seqtrie_iterator,local_48,&seq_kv_len,&offset);
            if (hVar7 == HBTRIE_RESULT_SUCCESS) {
              buf2kvid(8,local_48,&kv_id);
              pfVar9 = iterator->handle;
              bVar16 = kv_id == pfVar9->kvs->id;
              seqnum = local_40;
              goto LAB_0012dd50;
            }
            btreeblk_end(iterator->handle->bhandle);
LAB_0012e10f:
            iterator->_offset = 0xffffffffffffffff;
          }
          fVar4 = FDB_RESULT_ITERATOR_FAIL;
          goto LAB_0012dde8;
        }
        bVar17 = iterator->status == '\x01';
        do {
          if (bVar17) {
            iterator->tree_cursor_prev = pwVar8;
            pwVar8 = wal_itr_prev(iterator->wal_itr);
            iterator->tree_cursor = pwVar8;
            if (pwVar8 == (wal_item *)0x0) goto LAB_0012da35;
          }
          iterator->status = '\x01';
          uVar3 = iterator->opt;
        } while (((uVar3 & 1) == 0) &&
                (bVar17 = true,
                pwVar8->action == '\x02' ||
                (pwVar8->action == '\x01' & (byte)((uVar3 & 2) >> 1)) != 0));
        offset = pwVar8->offset;
        iterator->_offset = offset;
        iterator->_seqnum = pwVar8->seqnum;
LAB_0012dacd:
        if ((!bVar16) || ((uVar3 & 1) != 0)) goto LAB_0012ddd8;
        local_138.key = (void *)0x0;
        local_138.length._0_8_ = local_138.length._0_8_ & 0xffffffffffff0000;
        local_138.meta = (void *)0x0;
        local_138.body = (void *)0x0;
        iVar6 = 1;
        _offset = docio_read_doc_key_meta(handle,offset,&local_138,true);
        if (_offset < 1) {
          fVar4 = (fdb_status)_offset;
          if (_offset == 0) {
            fVar4 = FDB_RESULT_KEY_NOT_FOUND;
          }
          goto LAB_0012ddc9;
        }
        if (((local_138.length._8_8_ & 0x400000000) != 0) && ((iterator->opt & 2) != 0)) {
          free(local_138.key);
          free(local_138.meta);
          fVar4 = FDB_RESULT_KEY_NOT_FOUND;
          goto LAB_0012ddc9;
        }
        doc_kv.key = local_138.key;
        doc_kv.keylen = local_138.length._0_8_ & 0xffff;
        doc_kv.seqnum = 0xffffffffffffffff;
        shandle = iterator->handle->shandle;
        fVar4 = wal_find(shandle->snap_txn,iterator->handle->file,&shandle->cmp_info,shandle,&doc_kv
                         ,(uint64_t *)&_offset);
        if (((fVar4 == FDB_RESULT_SUCCESS) && ((iterator->field_10).start_seqnum <= doc_kv.seqnum))
           && (doc_kv.seqnum <= (iterator->field_12).end_seqnum)) {
LAB_0012dbd9:
          free(local_138.key);
          pvVar14 = local_138.meta;
LAB_0012dbe3:
          free(pvVar14);
          iVar6 = 2;
        }
        else {
          local_88.timestamp = 0;
          local_88.length.keylen = 0;
          local_88.length.metalen = 0;
          local_88.length.bodylen = 0;
          local_88.length.bodylen_ondisk = 0;
          local_88.length.flag = '\0';
          local_88.length.checksum = '\0';
          local_88.length.reserved = 0;
          local_88.meta = (void *)0x0;
          local_88.body = (void *)0x0;
          local_88.key = (void *)0x0;
          local_88.field_3.seqnum = 0;
          hVar7 = hbtrie_find(iterator->handle->trie,local_138.key,(uint)local_138.length.keylen,
                              &hboffset);
          btreeblk_end(iterator->handle->bhandle);
          if (hVar7 != HBTRIE_RESULT_SUCCESS) goto LAB_0012dbd9;
          local_88.key = local_138.key;
          local_88.meta = (void *)0x0;
          hboffset = hboffset >> 0x38 | (hboffset & 0xff000000000000) >> 0x28 |
                     (hboffset & 0xff0000000000) >> 0x18 | (hboffset & 0xff00000000) >> 8 |
                     (hboffset & 0xff000000) << 8 | (hboffset & 0xff0000) << 0x18 |
                     (hboffset & 0xff00) << 0x28 | hboffset << 0x38;
          iVar10 = docio_read_doc_key_meta(iterator->handle->dhandle,hboffset,&local_88,true);
          if (0 < iVar10) {
            if ((local_88.field_3.seqnum <= local_138.field_3.seqnum) ||
               ((iterator->field_12).end_seqnum < local_88.field_3.seqnum)) {
              free(local_88.meta);
              free(local_138.key);
              free(local_138.meta);
              iVar6 = 0;
              goto LAB_0012dbeb;
            }
            free(local_138.key);
            free(local_138.meta);
            pvVar14 = local_88.meta;
            goto LAB_0012dbe3;
          }
          free(local_138.key);
          free(local_138.meta);
          if (iVar10 == 0) {
            iVar10 = -9;
          }
          local_150 = (docio_handle *)CONCAT44(local_150._4_4_,(int)iVar10);
        }
LAB_0012dbeb:
        bVar16 = true;
      } while (iVar6 == 2);
      if (iVar6 == 0) {
LAB_0012ddd8:
        iterator->_dhandle = handle;
        iterator->_get_offset = offset;
        fVar4 = FDB_RESULT_SUCCESS;
        break;
      }
      fVar4 = (fdb_status)local_150;
LAB_0012ddc9:
    } while (fVar4 == FDB_RESULT_KEY_NOT_FOUND);
LAB_0012dde8:
    if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0012e0a4:
      iterator->_dhandle = (docio_handle *)0x0;
      if ((iterator->direction != '\0') &&
         (((iterator->seqtree_iterator != (btree_iterator *)0x0 ||
           (iterator->seqtrie_iterator != (hbtrie_iterator *)0x0)) && (iterator->status == '\0'))))
      {
        iterator->_offset = 0xffffffffffffffff;
      }
      goto LAB_0012e0ce;
    }
  }
  else {
    if (iterator->direction != '\x02') {
      iterator->_offset = 0xffffffffffffffff;
      if (iterator->tree_cursor == (wal_item *)0x0) {
        if (iterator->tree_cursor_prev != (wal_item *)0x0) {
          pwVar8 = wal_itr_search_smaller(iterator->wal_itr,iterator->tree_cursor_prev);
          iterator->tree_cursor = pwVar8;
          iterator->status = '\0';
        }
      }
      else {
        pwVar8 = wal_itr_search_smaller(iterator->wal_itr,iterator->tree_cursor);
        iterator->tree_cursor = pwVar8;
        if ((iterator->direction == '\x01') && (iterator->status != '\x01')) {
          pwVar8 = wal_itr_prev(iterator->wal_itr);
          iterator->tree_cursor = pwVar8;
        }
      }
    }
    value_buf = &iterator->_offset;
    local_f0 = &iterator->_keylen;
    hVar7 = HBTRIE_RESULT_SUCCESS;
LAB_0012de22:
    do {
      keylen = local_f0;
      pvVar14 = iterator->_key;
      local_150 = iterator->handle->dhandle;
      if (iterator->_offset == 0xffffffffffffffff) {
        doc_kv.bodylen = doc_kv.bodylen & 0xffffffff00000000;
        doc_kv.keylen = 0;
        doc_kv.metalen = 0;
        doc_kv.seqnum = 0;
        doc_kv.offset = 0;
        doc_kv.size_ondisk = 0;
        doc_kv.key = (void *)0x0;
        do {
          do {
            hVar7 = hbtrie_prev(iterator->hbtrie_iterator,pvVar14,keylen,value_buf);
            btreeblk_end(iterator->handle->bhandle);
            uVar13 = iterator->_offset;
            uVar13 = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                     (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
                     (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                     (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38;
            iterator->_offset = uVar13;
            if (((iterator->opt & 2) == 0) || (hVar7 != HBTRIE_RESULT_SUCCESS)) goto LAB_0012de45;
            doc_kv.key = (void *)0x0;
            doc_kv.seqnum = 0;
            doc_kv.bodylen = 0;
            doc_kv.size_ondisk = 0;
            doc_kv.keylen = 0;
            doc_kv.metalen = 0;
            doc_kv.offset = 0;
            iVar10 = docio_read_doc_key_meta(local_150,uVar13,(docio_object *)&doc_kv,true);
            sVar12 = doc_kv.metalen;
          } while (iVar10 < 1);
          free((void *)doc_kv.size_ondisk);
          free((void *)doc_kv.seqnum);
        } while ((sVar12 & 0x400000000) != 0);
        hVar7 = HBTRIE_RESULT_SUCCESS;
      }
LAB_0012de45:
      if (hVar7 == HBTRIE_RESULT_INDEX_CORRUPTED) {
        fVar4 = FDB_RESULT_FILE_CORRUPTION;
        goto LAB_0012e0a4;
      }
      sVar12 = *keylen;
      uVar15 = *value_buf;
      if ((hVar7 != HBTRIE_RESULT_SUCCESS) && (iterator->tree_cursor == (wal_item *)0x0))
      goto LAB_0012e09d;
      do {
        local_140 = uVar15;
        pwVar8 = iterator->tree_cursor;
        uVar15 = local_140;
        if (pwVar8 == (wal_item *)0x0) goto LAB_0012e017;
        if (iterator->status == '\x01') {
          iterator->tree_cursor_prev = pwVar8;
          pwVar8 = wal_itr_prev(iterator->wal_itr);
          iterator->tree_cursor = pwVar8;
          if (pwVar8 == (wal_item *)0x0) {
            uVar15 = local_140;
            if (hVar7 == HBTRIE_RESULT_SUCCESS) goto LAB_0012e017;
            goto LAB_0012e09d;
          }
        }
        iVar6 = 1;
        if ((hVar7 == HBTRIE_RESULT_SUCCESS) &&
           (iVar6 = _fdb_key_cmp(iterator,pwVar8->header->key,(ulong)pwVar8->header->keylen,pvVar14,
                                 sVar12), uVar15 = local_140, iVar6 < 0)) goto LAB_0012e017;
        wVar2 = pwVar8->action;
        if (wVar2 == '\x01') {
          bVar11 = ((byte)iterator->opt & 2) >> 1;
        }
        else {
          bVar11 = 0;
        }
        iterator->status = '\x01';
        if (iVar6 == 0) {
          *value_buf = 0xffffffffffffffff;
          if (wVar2 == '\x02' || bVar11 != 0) goto LAB_0012de22;
          break;
        }
        uVar15 = local_140;
      } while (wVar2 == '\x02' || bVar11 != 0);
      pvVar14 = pwVar8->header->key;
      sVar12 = (size_t)pwVar8->header->keylen;
      uVar15 = pwVar8->offset;
LAB_0012e017:
      if (uVar15 == *value_buf) {
        iterator->_offset = 0xffffffffffffffff;
        iterator->status = '\0';
      }
      if (iterator->start_key != (void *)0x0) {
        iVar6 = _fdb_key_cmp(iterator,iterator->start_key,(iterator->field_10).start_keylen,pvVar14,
                             sVar12);
        if (iVar6 == 0) {
          if ((iterator->opt & 4) != 0) goto LAB_0012e09d;
        }
        else if (0 < iVar6) {
LAB_0012e09d:
          fVar4 = FDB_RESULT_ITERATOR_FAIL;
          goto LAB_0012e0a4;
        }
      }
      if (iterator->end_key == (void *)0x0) break;
      iVar6 = _fdb_key_cmp(iterator,iterator->end_key,(iterator->field_12).end_keylen,pvVar14,sVar12
                          );
      if (iVar6 != 0) {
        if (-1 < iVar6) break;
        goto LAB_0012de22;
      }
    } while ((iterator->opt & 8) != 0);
    iterator->_dhandle = local_150;
    iterator->_get_offset = uVar15;
  }
  iterator->direction = '\x02';
  fVar4 = FDB_RESULT_SUCCESS;
LAB_0012e0ce:
  paVar1 = &iterator->handle->handle_busy;
  LOCK();
  if ((paVar1->super___atomic_base<unsigned_char>)._M_i == '\x01') {
    (paVar1->super___atomic_base<unsigned_char>)._M_i = '\0';
  }
  UNLOCK();
  atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_moves,memory_order_relaxed);
  return fVar4;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_prev(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status result = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (!atomic_cas_uint8_t(&iterator->handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (iterator->hbtrie_iterator) {
        while ((result = _fdb_iterator_prev(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    } else {
        while ((result = _fdb_iterator_seq_prev(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    }
    if (result == FDB_RESULT_SUCCESS) {
        iterator->direction = FDB_ITR_REVERSE;
    } else {
        iterator->_dhandle = NULL; // fail fdb_iterator_get also
        if (iterator->direction != FDB_ITR_DIR_NONE) {
            if ((iterator->seqtree_iterator || iterator->seqtrie_iterator) &&
                    iterator->status == FDB_ITR_IDX) {
                iterator->_offset = BLK_NOT_FOUND;
            }
        }
    }

    atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
    atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_moves,
                         std::memory_order_relaxed);
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_PREV);
    return result;
}